

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_info.cpp
# Opt level: O3

optional_idx duckdb::GetStorageVersion(char *version_string)

{
  long lVar1;
  int iVar2;
  long lVar3;
  undefined1 *puVar4;
  optional_idx local_20;
  
  iVar2 = strcmp("v0.0.4",version_string);
  if (iVar2 == 0) {
    puVar4 = storage_version_info;
  }
  else {
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      if (lVar3 + 0x10 == 0x340) {
        return (optional_idx)0xffffffffffffffff;
      }
      iVar2 = strcmp(*(char **)(storage_version_info + lVar3 + 0x10),version_string);
      lVar1 = lVar3 + 0x10;
    } while (iVar2 != 0);
    puVar4 = (undefined1 *)(lVar3 + 0x2448c00);
  }
  optional_idx::optional_idx(&local_20,*(idx_t *)(puVar4 + 8));
  return (optional_idx)local_20.index;
}

Assistant:

optional_idx GetStorageVersion(const char *version_string) {
	for (idx_t i = 0; storage_version_info[i].version_name; i++) {
		if (!strcmp(storage_version_info[i].version_name, version_string)) {
			return storage_version_info[i].storage_version;
		}
	}
	return optional_idx();
}